

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

int32 feat_s2mfc2feat_live
                (feat_t *fcb,mfcc_t **uttcep,int32 *inout_ncep,int32 beginutt,int32 endutt,
                mfcc_t ***ofeat)

{
  mfcc_t *pmVar1;
  int iVar2;
  uint32 nfr;
  int iVar3;
  mfcc_t **mfc;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  size_t __n;
  ulong uVar10;
  mfcc_t **ppmVar11;
  long lVar12;
  int iVar13;
  int local_5c;
  int32 *local_50;
  int32 local_3c;
  int32 *local_38;
  
  if (endutt == 0 || beginutt == 0) {
    iVar3 = fcb->cepsize;
    iVar6 = fcb->window_size;
    if (beginutt != 0) goto LAB_0012dce5;
    local_5c = -iVar6;
    iVar2 = fcb->bufpos - fcb->curpos;
    iVar4 = iVar2 + 0x100;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    iVar2 = iVar6;
    if (endutt == 0) {
      iVar2 = 0;
    }
    iVar2 = iVar2 + iVar4;
    if (inout_ncep == (int32 *)0x0) goto LAB_0012dd90;
    iVar4 = *inout_ncep;
LAB_0012dd26:
    if (0x100 < iVar4 + iVar2) {
      iVar4 = (0x100 - iVar6) - iVar2;
      *inout_ncep = iVar4;
      endutt = 0;
    }
    feat_cmn(fcb,uttcep,iVar4,beginutt,endutt);
    feat_agc(fcb,uttcep,*inout_ncep,beginutt,endutt);
    local_3c = endutt;
    if (beginutt == 0) {
      iVar13 = 0;
      goto LAB_0012de7a;
    }
    iVar4 = *inout_ncep;
    iVar13 = 0;
  }
  else {
    if (inout_ncep != (int32 *)0x0) {
      iVar6 = *inout_ncep;
      lVar7 = (long)iVar6;
      if (0 < lVar7) {
        iVar3 = fcb->window_size;
        lVar12 = (long)iVar3;
        iVar4 = fcb->cepsize;
        iVar2 = iVar6 + iVar3 * 2;
        mfc = (mfcc_t **)
              __ckd_calloc__((long)iVar2,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                             ,0x507);
        ppmVar11 = mfc + lVar12;
        memcpy(ppmVar11,uttcep,lVar7 * 8);
        feat_cmn(fcb,ppmVar11,iVar6,1,1);
        feat_agc(fcb,ppmVar11,iVar6,1,1);
        if (0 < lVar12) {
          __n = (long)iVar4 << 2;
          lVar8 = 0;
          do {
            pmVar1 = fcb->cepbuf[lVar8];
            mfc[lVar8] = pmVar1;
            memcpy(pmVar1,*uttcep,__n);
            pmVar1 = fcb->cepbuf[lVar12 + lVar8];
            mfc[(ulong)(uint)(iVar6 + iVar3) + lVar8] = pmVar1;
            memcpy(pmVar1,uttcep[lVar7 + -1],__n);
            lVar8 = lVar8 + 1;
          } while (lVar12 != lVar8);
        }
        feat_compute_utt(fcb,mfc,iVar2,iVar3,ofeat);
        ckd_free(mfc);
        return iVar6;
      }
    }
    iVar3 = fcb->cepsize;
    iVar6 = fcb->window_size;
LAB_0012dce5:
    local_5c = -iVar6;
    fcb->bufpos = fcb->curpos;
    if (inout_ncep != (int32 *)0x0) {
      iVar4 = *inout_ncep;
      iVar13 = 0;
      if (0 < iVar4) {
        iVar13 = iVar6;
      }
      iVar2 = iVar6;
      if (endutt == 0) {
        iVar2 = 0;
      }
      iVar2 = iVar2 + iVar13;
      goto LAB_0012dd26;
    }
    iVar2 = iVar6;
    if (endutt == 0) {
      iVar2 = 0;
    }
LAB_0012dd90:
    iVar4 = (0x100 - iVar6) - iVar2;
    local_3c = 0;
    if (iVar2 < 0x101) {
      iVar4 = local_3c;
      local_3c = endutt;
    }
    feat_cmn(fcb,uttcep,iVar4,beginutt,local_3c);
    feat_agc(fcb,uttcep,iVar4,beginutt,local_3c);
    iVar13 = iVar4;
    if (beginutt == 0) goto LAB_0012de7a;
  }
  local_38 = &fcb->bufpos;
  local_50 = &fcb->curpos;
  if (0 < iVar4) {
    iVar4 = *local_38;
    if (0 < iVar6) {
      iVar9 = iVar6;
      do {
        fcb->bufpos = iVar4 + 1;
        memcpy(fcb->cepbuf[iVar4],*uttcep,(long)iVar3 << 2);
        iVar4 = fcb->bufpos % 0x100;
        fcb->bufpos = iVar4;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    *local_50 = iVar4;
    iVar2 = iVar2 - iVar6;
  }
LAB_0012de7a:
  local_38 = &fcb->bufpos;
  local_50 = &fcb->curpos;
  lVar7 = 0;
  while( true ) {
    iVar4 = iVar13;
    if (inout_ncep != (int32 *)0x0) {
      iVar4 = *inout_ncep;
    }
    if (iVar4 <= lVar7) break;
    iVar4 = fcb->bufpos;
    fcb->bufpos = iVar4 + 1;
    memcpy(fcb->cepbuf[iVar4],uttcep[lVar7],(long)iVar3 << 2);
    fcb->bufpos = fcb->bufpos % 0x100;
    lVar7 = lVar7 + 1;
  }
  if (local_3c != 0) {
    iVar4 = *local_38;
    iVar13 = 0xff;
    if (iVar4 != 0) {
      iVar13 = iVar4 + -1;
    }
    if (0 < iVar6) {
      iVar9 = iVar6;
      do {
        fcb->bufpos = iVar4 + 1;
        memcpy(fcb->cepbuf[iVar4],fcb->cepbuf[iVar13],(long)iVar3 << 2);
        iVar4 = fcb->bufpos % 0x100;
        fcb->bufpos = iVar4;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  nfr = (iVar2 - iVar6) + (int)lVar7;
  if ((int)nfr < 1) {
    nfr = 0;
  }
  else {
    iVar3 = fcb->curpos;
    uVar10 = 0;
    do {
      if ((iVar3 < iVar6) || (0xff < iVar3 + iVar6)) {
        if (local_5c <= iVar6) {
          iVar3 = iVar3 + local_5c + 0x100;
          lVar12 = (long)local_5c + (long)iVar6;
          iVar4 = (iVar6 - local_5c) + 1;
          do {
            fcb->tmpcepbuf[lVar12] = fcb->cepbuf[iVar3 % 0x100];
            lVar12 = lVar12 + 1;
            iVar3 = iVar3 + 1;
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        ppmVar11 = fcb->tmpcepbuf + iVar6;
      }
      else {
        ppmVar11 = fcb->cepbuf + iVar3;
      }
      (*fcb->compute_feat)(fcb,ppmVar11,ofeat[uVar10]);
      iVar3 = *local_50;
      uVar5 = iVar3 + 0x100;
      if (-1 < (int)(iVar3 + 1U)) {
        uVar5 = iVar3 + 1U;
      }
      iVar3 = (iVar3 - (uVar5 & 0xffffff00)) + 1;
      *local_50 = iVar3;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)((iVar2 - iVar6) + (int)lVar7));
    if (fcb->lda != (mfcc_t ***)0x0) {
      feat_lda_transform(fcb,ofeat,nfr);
    }
    if (fcb->subvecs != (int32 **)0x0) {
      feat_subvec_project(fcb,ofeat,nfr);
    }
  }
  return nfr;
}

Assistant:

int32
feat_s2mfc2feat_live(feat_t * fcb, mfcc_t ** uttcep, int32 *inout_ncep,
		     int32 beginutt, int32 endutt, mfcc_t *** ofeat)
{
    int32 win, cepsize, nbufcep;
    int32 i, j, nfeatvec;
    int32 zero = 0;

    /* Avoid having to check this everywhere. */
    if (inout_ncep == NULL) inout_ncep = &zero;

    /* Special case for entire utterances. */
    if (beginutt && endutt && *inout_ncep > 0)
        return feat_s2mfc2feat_block_utt(fcb, uttcep, *inout_ncep, ofeat);

    win = feat_window_size(fcb);
    cepsize = feat_cepsize(fcb);

    /* Empty the input buffer on start of utterance. */
    if (beginutt)
        fcb->bufpos = fcb->curpos;

    /* Calculate how much data is in the buffer already. */
    nbufcep = fcb->bufpos - fcb->curpos;
    if (nbufcep < 0)
	nbufcep = fcb->bufpos + LIVEBUFBLOCKSIZE - fcb->curpos;
    /* Add any data that we have to replicate. */
    if (beginutt && *inout_ncep > 0)
        nbufcep += win;
    if (endutt)
        nbufcep += win;

    /* Only consume as much input as will fit in the buffer. */
    if (nbufcep + *inout_ncep > LIVEBUFBLOCKSIZE) {
        /* We also can't overwrite the trailing window, hence the
         * reason why win is subtracted here. */
        *inout_ncep = LIVEBUFBLOCKSIZE - nbufcep - win;
        /* Cancel end of utterance processing. */
        endutt = FALSE;
    }

    /* FIXME: Don't modify the input! */
    feat_cmn(fcb, uttcep, *inout_ncep, beginutt, endutt);
    feat_agc(fcb, uttcep, *inout_ncep, beginutt, endutt);

    /* Replicate first frame into the first win frames if we're at the
     * beginning of the utterance and there was some actual input to
     * deal with.  (FIXME: Not entirely sure why that condition) */
    if (beginutt && *inout_ncep > 0) {
        for (i = 0; i < win; i++) {
            memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[0],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
        /* Move the current pointer past this data. */
        fcb->curpos = fcb->bufpos;
        nbufcep -= win;
    }

    /* Copy in frame data to the circular buffer. */
    for (i = 0; i < *inout_ncep; ++i) {
        memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[i],
               cepsize * sizeof(mfcc_t));
        fcb->bufpos %= LIVEBUFBLOCKSIZE;
	++nbufcep;
    }

    /* Replicate last frame into the last win frames if we're at the
     * end of the utterance (even if there was no input, so we can
     * flush the output). */
    if (endutt) {
        int32 tpos; /* Index of last input frame. */
        if (fcb->bufpos == 0)
            tpos = LIVEBUFBLOCKSIZE - 1;
        else
            tpos = fcb->bufpos - 1;
        for (i = 0; i < win; ++i) {
            memcpy(fcb->cepbuf[fcb->bufpos++], fcb->cepbuf[tpos],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
    }

    /* We have to leave the trailing window of frames. */
    nfeatvec = nbufcep - win;
    if (nfeatvec <= 0)
        return 0; /* Do nothing. */

    for (i = 0; i < nfeatvec; ++i) {
        /* Handle wraparound cases. */
        if (fcb->curpos - win < 0 || fcb->curpos + win >= LIVEBUFBLOCKSIZE) {
            /* Use tmpcepbuf for this case.  Actually, we just need the pointers. */
            for (j = -win; j <= win; ++j) {
                int32 tmppos =
                    (fcb->curpos + j + LIVEBUFBLOCKSIZE) % LIVEBUFBLOCKSIZE;
		fcb->tmpcepbuf[win + j] = fcb->cepbuf[tmppos];
            }
            fcb->compute_feat(fcb, fcb->tmpcepbuf + win, ofeat[i]);
        }
        else {
            fcb->compute_feat(fcb, fcb->cepbuf + fcb->curpos, ofeat[i]);
        }
	/* Move the read pointer forward. */
        ++fcb->curpos;
        fcb->curpos %= LIVEBUFBLOCKSIZE;
    }

    if (fcb->lda)
        feat_lda_transform(fcb, ofeat, nfeatvec);

    if (fcb->subvecs)
        feat_subvec_project(fcb, ofeat, nfeatvec);

    return nfeatvec;
}